

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_orderedCollection_asWordArray(sysbvm_context_t *context,sysbvm_tuple_t orderedCollection)

{
  _Bool _Var1;
  uint32_t uVar2;
  sysbvm_size_t slotCount;
  sysbvm_tuple_t tuple;
  size_t local_48;
  size_t i;
  uint32_t *words;
  sysbvm_tuple_t wordArray;
  size_t size;
  sysbvm_orderedCollection_t *orderedCollectionObject;
  sysbvm_tuple_t orderedCollection_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(orderedCollection);
  if (_Var1) {
    if (*(long *)(orderedCollection + 0x18) == 0) {
      context_local = (sysbvm_context_t *)sysbvm_wordArray_create(context,0);
    }
    else {
      slotCount = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(orderedCollection + 0x10));
      context_local = (sysbvm_context_t *)sysbvm_wordArray_create(context,slotCount);
      for (local_48 = 0; local_48 < slotCount; local_48 = local_48 + 1) {
        tuple = sysbvm_array_at(*(sysbvm_tuple_t *)(orderedCollection + 0x18),local_48);
        uVar2 = sysbvm_tuple_uint32_decode(tuple);
        *(uint32_t *)(&(context_local->heap).shouldAttemptToCollect + local_48 * 4) = uVar2;
      }
    }
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_orderedCollection_asWordArray(sysbvm_context_t *context, sysbvm_tuple_t orderedCollection)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection))
        return SYSBVM_NULL_TUPLE;

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    if(!orderedCollectionObject->storage)
        return sysbvm_wordArray_create(context, 0);

    size_t size = sysbvm_tuple_size_decode(orderedCollectionObject->size);
    sysbvm_tuple_t wordArray = sysbvm_wordArray_create(context, size);
    uint32_t *words = (uint32_t*)SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(wordArray)->bytes;
    for(size_t i = 0; i < size; ++i)
        words[i] = sysbvm_tuple_uint32_decode(sysbvm_array_at(orderedCollectionObject->storage, i));

    return wordArray;
}